

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O0

void __thiscall
COLLADAFW::ArrayPrimitiveType<COLLADAFW::JointPrimitive_*>::allocMemory
          (ArrayPrimitiveType<COLLADAFW::JointPrimitive_*> *this,size_t capacity,int flags)

{
  JointPrimitive **data;
  uint in_EDX;
  size_t in_RSI;
  ArrayPrimitiveType<COLLADAFW::JointPrimitive_*> *in_RDI;
  
  if (in_RSI == 0) {
    setData(in_RDI,(JointPrimitive **)0x0,0,0);
  }
  else {
    data = (JointPrimitive **)malloc(in_RSI << 3);
    setData(in_RDI,data,0,in_RSI);
  }
  in_RDI->mFlags = in_EDX | in_RDI->mFlags;
  return;
}

Assistant:

void allocMemory ( size_t capacity, int flags = DEFAULT_ALLOC_FLAGS )
		{
			if ( capacity == 0 )
				setData ( 0, 0, 0 );
			else
				setData ( ( Type* ) ( malloc ( capacity * sizeof (Type) ) ), 0, capacity );
			mFlags |= flags;
		}